

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O0

void __thiscall FGameConfigFile::SetRavenDefaults(FGameConfigFile *this,bool isHexen)

{
  UCVarValue value;
  UCVarValue value_00;
  UCVarValue value_01;
  UCVarValue value_02;
  UCVarValue value_03;
  UCVarValue value_04;
  UCVarValue value_05;
  UCVarValue value_06;
  UCVarValue value_07;
  uint32 uVar1;
  undefined4 local_20;
  undefined4 uStack_1c;
  UCVarValue val;
  bool isHexen_local;
  FGameConfigFile *this_local;
  
  FBoolCVar::SetGenericRepDefault
            (&wi_percents,(char *)(CONCAT44(uStack_1c,local_20) & 0xffffffffffffff00),CVAR_Bool);
  local_20 = CONCAT31(local_20._1_3_,1);
  value._4_4_ = uStack_1c;
  value.Int = local_20;
  FBoolCVar::SetGenericRepDefault(&con_centernotify,value,CVAR_Bool);
  value_00._4_4_ = uStack_1c;
  value_00.Int = local_20;
  FBoolCVar::SetGenericRepDefault(&snd_pitched,value_00,CVAR_Bool);
  value_01._4_4_ = uStack_1c;
  value_01.Int = 9;
  FIntCVar::SetGenericRepDefault(&msg0color,value_01,CVAR_Int);
  value_02._4_4_ = uStack_1c;
  value_02.Int = 9;
  FIntCVar::SetGenericRepDefault(&msgmidcolor,value_02,CVAR_Int);
  value_03._4_4_ = uStack_1c;
  value_03.Int = 10;
  FIntCVar::SetGenericRepDefault(&msgmidcolor2,value_03,CVAR_Int);
  value_04._4_4_ = uStack_1c;
  value_04.Float = 7.735379e-39;
  FColorCVar::SetGenericRepDefault(&am_wallcolor,value_04,CVAR_Int);
  value_05._4_4_ = uStack_1c;
  value_05.Float = 1.9165106e-38;
  FColorCVar::SetGenericRepDefault(&am_fdwallcolor,value_05,CVAR_Int);
  value_06._4_4_ = uStack_1c;
  value_06.Float = 1.0585166e-38;
  FColorCVar::SetGenericRepDefault(&am_cdwallcolor,value_06,CVAR_Int);
  uVar1 = FColorCVar::operator*(&am_wallcolor);
  if (uVar1 == 0x2c1808) {
    uVar1 = FColorCVar::operator*(&am_fdwallcolor);
    if (uVar1 == 0x887058) {
      uVar1 = FColorCVar::operator*(&am_cdwallcolor);
      if (uVar1 == 0x4c3820) {
        FBaseCVar::ResetToDefault((FBaseCVar *)&am_wallcolor);
        FBaseCVar::ResetToDefault((FBaseCVar *)&am_fdwallcolor);
        FBaseCVar::ResetToDefault((FBaseCVar *)&am_cdwallcolor);
      }
    }
  }
  if (!isHexen) {
    value_07._4_4_ = uStack_1c;
    value_07.Float = 5.820164e-39;
    FColorCVar::SetGenericRepDefault(&::color,value_07,CVAR_Int);
  }
  return;
}

Assistant:

void FGameConfigFile::SetRavenDefaults (bool isHexen)
{
	UCVarValue val;

	val.Bool = false;
	wi_percents.SetGenericRepDefault (val, CVAR_Bool);
	val.Bool = true;
	con_centernotify.SetGenericRepDefault (val, CVAR_Bool);
	snd_pitched.SetGenericRepDefault (val, CVAR_Bool);
	val.Int = 9;
	msg0color.SetGenericRepDefault (val, CVAR_Int);
	val.Int = CR_WHITE;
	msgmidcolor.SetGenericRepDefault (val, CVAR_Int);
	val.Int = CR_YELLOW;
	msgmidcolor2.SetGenericRepDefault (val, CVAR_Int);

	val.Int = 0x543b17;
	am_wallcolor.SetGenericRepDefault (val, CVAR_Int);
	val.Int = 0xd0b085;
	am_fdwallcolor.SetGenericRepDefault (val, CVAR_Int);
	val.Int = 0x734323;
	am_cdwallcolor.SetGenericRepDefault (val, CVAR_Int);

	// Fix the Heretic/Hexen automap colors so they are correct.
	// (They were wrong on older versions.)
	if (*am_wallcolor == 0x2c1808 && *am_fdwallcolor == 0x887058 && *am_cdwallcolor == 0x4c3820)
	{
		am_wallcolor.ResetToDefault ();
		am_fdwallcolor.ResetToDefault ();
		am_cdwallcolor.ResetToDefault ();
	}

	if (!isHexen)
	{
		val.Int = 0x3f6040;
		color.SetGenericRepDefault (val, CVAR_Int);
	}
}